

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommand.cxx
# Opt level: O1

void __thiscall
cmCustomCommand::SetCommandLines(cmCustomCommand *this,cmCustomCommandLines *commandLines)

{
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::_M_move_assign
            (&(this->CommandLines).
              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  return;
}

Assistant:

void cmCustomCommand::SetCommandLines(cmCustomCommandLines commandLines)
{
  this->CommandLines = std::move(commandLines);
}